

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexSubImage2DArrayBufferCase::createTexture
          (TexSubImage2DArrayBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  TransferFormat TVar5;
  int iVar6;
  TransferFormat TVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  deUint32 buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TextureFormat *local_88;
  TransferFormat local_80;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  this_01 = &(this->super_Texture2DArraySpecCase).m_texFormat;
  TVar7 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  local_88 = this_01;
  iVar6 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
  uVar10 = (this->super_Texture2DArraySpecCase).m_width * iVar6 + 3U & 0xfffffffc;
  iVar8 = (this->super_Texture2DArraySpecCase).m_height * uVar10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->super_Texture2DArraySpecCase).m_numLayers * iVar8));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,local_88,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,uVar10,iVar8,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::fillWithComponentGradients
            (&local_58,&(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin,
             &(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x8c1a,0,this->m_internalFormat,(this->super_Texture2DArraySpecCase).m_width,
             (this->super_Texture2DArraySpecCase).m_height,
             (this->super_Texture2DArraySpecCase).m_numLayers,0,TVar7.format,TVar7.dataType,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar8 = this->m_rowLength;
  if (iVar8 < 1) {
    iVar8 = this->m_subW;
  }
  iVar9 = this->m_imageHeight;
  if (iVar9 < 1) {
    iVar9 = this->m_subH;
  }
  fVar1 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin.m_data[0];
  fVar2 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin.m_data[1];
  fVar3 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin.m_data[2];
  fVar4 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin.m_data[3];
  fVar11 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1;
  fVar12 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2;
  fVar13 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3;
  fVar14 = (this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4;
  uVar10 = (this->m_alignment + iVar8 * iVar6) - 1U & -this->m_alignment;
  colorA.m_data[0] = fVar11 * 1.0 + fVar1;
  colorA.m_data[1] = fVar12 * 0.0 + fVar2;
  colorA.m_data[2] = fVar13 * 0.0 + fVar3;
  colorA.m_data[3] = fVar14 * 1.0 + fVar4;
  colorB.m_data[0] = fVar11 * 0.0 + fVar1;
  colorB.m_data[1] = fVar12 * 1.0 + fVar2;
  colorB.m_data[2] = fVar13 * 0.0 + fVar3;
  colorB.m_data[3] = fVar14 * 1.0 + fVar4;
  iVar9 = iVar9 * uVar10;
  local_80 = TVar7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)((this->m_skipImages + (this->super_Texture2DArraySpecCase).m_numLayers) *
                          iVar9 + this->m_offset));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,local_88,this->m_subW,this->m_subH,this->m_subD,uVar10,iVar9,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset +
             (long)(this->m_skipPixels * iVar6) + (long)(int)(this->m_skipRows * uVar10) +
             (long)(this->m_skipImages * iVar9));
  tcu::fillWithGrid(&local_58,4,&colorA,&colorB);
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  TVar5 = local_80;
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glTexSubImage3D
            (this_00,0x8c1a,0,this->m_subX,this->m_subY,this->m_subZ,this->m_subW,this->m_subH,
             this->m_subD,TVar5.format,TVar7.dataType,(void *)(long)this->m_offset);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);

		// Fill with gradient.
		{
			int		rowPitch		= deAlign32(pixelSize*m_width,  4);
			int		slicePitch		= rowPitch*m_height;

			data.resize(slicePitch*m_numLayers);
			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, m_numLayers, rowPitch, slicePitch, &data[0]), m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
		}

		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, m_internalFormat, m_width, m_height, m_numLayers, 0, transferFmt.format, transferFmt.dataType, &data[0]);

		// Fill data with grid.
		{
			int		rowLength		= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
			int		imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_subH;
			int		slicePitch		= imageHeight*rowPitch;
			Vec4	cScale			= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias			= m_texFormatInfo.valueMin;
			Vec4	colorA			= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB			= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(slicePitch*(m_numLayers+m_skipImages) + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, m_subD, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, m_subX, m_subY, m_subZ, m_subW, m_subH, m_subD, transferFmt.format, transferFmt.dataType, (const void*)(deIntptr)m_offset);
	}